

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O2

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::encode_at_current_rate<bool,bool>
          (RateAdaptiveCode<unsigned_int> *this,vector<bool,_std::allocator<bool>_> *in,
          vector<bool,_std::allocator<bool>_> *out)

{
  pointer pvVar1;
  uint *puVar2;
  const_reference cVar3;
  ulong *puVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t i;
  ulong __n;
  uint *var_node;
  uint *puVar7;
  reference rVar8;
  reference rVar9;
  
  if ((ulong)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 == this->n_cols) {
    __n = 0;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (out,((long)(this->pos_varn).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->pos_varn).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,false);
    while( true ) {
      pvVar1 = (this->pos_varn).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->pos_varn).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= __n)
      break;
      puVar2 = *(pointer *)
                ((long)&pvVar1[__n].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data + 8);
      for (puVar7 = pvVar1[__n].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
      {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](out,__n);
        cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](in,(ulong)*puVar7);
        uVar6 = *rVar8._M_p;
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](out,__n);
        puVar4 = rVar9._M_p;
        if (cVar3 == ((uVar6 & rVar8._M_mask) != 0)) {
          uVar6 = ~rVar9._M_mask & *puVar4;
        }
        else {
          uVar6 = rVar9._M_mask | *puVar4;
        }
        *puVar4 = uVar6;
      }
      __n = __n + 1;
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Encoder received invalid input length.");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

constexpr void encode_at_current_rate(
                const std::vector<BitL> &in, std::vector<BitR> &out) const {
            if (in.size() != n_cols) {
                LDPC4QKD_DEBUG_MESSAGE("Encoder received invalid input length.");  // TODO maybe use exception?
                return;
            }

            out.assign(pos_varn.size(), 0);

            for (std::size_t i{}; i < pos_varn.size(); ++i) {
                for (auto &var_node: pos_varn[i]) {
                    out[i] = xor_as_bools(out[i], in[var_node]);
                }
            }
        }